

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonEachNext(sqlite3_vtab_cursor *cur)

{
  char cVar1;
  sqlite3_vtab *psVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  if (*(char *)((long)&cur[3].pVtab + 1) == '\0') {
    if (*(char *)&cur[3].pVtab == '\a') {
      uVar3 = *(uint *)&cur[2].pVtab;
      if (*(byte *)(&(cur[7].pVtab)->pModule + (ulong)(uVar3 + 1) * 2) < 6) {
        iVar5 = 2;
      }
      else {
        iVar5 = *(int *)((long)&(cur[7].pVtab)->pModule + (ulong)(uVar3 + 1) * 0x10 + 4) + 2;
      }
    }
    else {
      if (*(char *)&cur[3].pVtab != '\x06') {
        *(undefined4 *)&cur[2].pVtab = *(undefined4 *)((long)&cur[2].pVtab + 4);
        return 0;
      }
      uVar3 = *(uint *)&cur[2].pVtab;
      if (*(byte *)(&(cur[7].pVtab)->pModule + (ulong)uVar3 * 2) < 6) {
        iVar5 = 1;
      }
      else {
        iVar5 = *(int *)((long)&(cur[7].pVtab)->pModule + (ulong)uVar3 * 0x10 + 4) + 1;
      }
    }
    *(uint *)&cur[2].pVtab = iVar5 + uVar3;
    *(int *)&cur[1].pVtab = *(int *)&cur[1].pVtab + 1;
  }
  else {
    psVar2 = cur[7].pVtab;
    uVar4 = *(uint *)&cur[2].pVtab +
            (uint)((*(byte *)((long)&psVar2->pModule + (ulong)*(uint *)&cur[2].pVtab * 0x10 + 1) >>
                    6 & 1) != 0);
    uVar3 = uVar4 + 1;
    *(uint *)&cur[2].pVtab = uVar3;
    *(int *)&cur[1].pVtab = *(int *)&cur[1].pVtab + 1;
    if (uVar3 < *(uint *)((long)&cur[2].pVtab + 4)) {
      uVar3 = *(uint *)((long)&(cur[9].pVtab)->pModule + (ulong)uVar3 * 4);
      uVar6 = (ulong)uVar3;
      cVar1 = *(char *)(&psVar2->pModule + uVar6 * 2);
      *(char *)&cur[3].pVtab = cVar1;
      if (cVar1 == '\x06') {
        if (uVar3 == uVar4) {
          (&psVar2->nRef)[uVar6 * 4] = 0;
        }
        else {
          (&psVar2->nRef)[uVar6 * 4] = (&psVar2->nRef)[uVar6 * 4] + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jsonEachNext(sqlite3_vtab_cursor *cur){
  JsonEachCursor *p = (JsonEachCursor*)cur;
  if( p->bRecursive ){
    if( p->sParse.aNode[p->i].jnFlags & JNODE_LABEL ) p->i++;
    p->i++;
    p->iRowid++;
    if( p->i<p->iEnd ){
      u32 iUp = p->sParse.aUp[p->i];
      JsonNode *pUp = &p->sParse.aNode[iUp];
      p->eType = pUp->eType;
      if( pUp->eType==JSON_ARRAY ){
        assert( pUp->eU==0 || pUp->eU==3 );
        testcase( pUp->eU==3 );
        VVA( pUp->eU = 3 );
        if( iUp==p->i-1 ){
          pUp->u.iKey = 0;
        }else{
          pUp->u.iKey++;
        }
      }
    }
  }else{
    switch( p->eType ){
      case JSON_ARRAY: {
        p->i += jsonNodeSize(&p->sParse.aNode[p->i]);
        p->iRowid++;
        break;
      }
      case JSON_OBJECT: {
        p->i += 1 + jsonNodeSize(&p->sParse.aNode[p->i+1]);
        p->iRowid++;
        break;
      }
      default: {
        p->i = p->iEnd;
        break;
      }
    }
  }
  return SQLITE_OK;
}